

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::argument_loader<Job*,std::__cxx11::string_const&>::load_impl_sequence<0ul,1ul>
          (argument_loader<Job*,std::__cxx11::string_const&> *this,long src)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RAX;
  long lVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if ((*(byte *)(*(long *)(src + 8) + 0xab) & 4) != 0) {
    bVar2 = type_caster_generic::load
                      ((type_caster_generic *)(this + 0x28),*(PyObject **)(src + 0x18),true);
    uStack_18._0_7_ = CONCAT16(bVar2,(undefined6)uStack_18);
    if ((*(byte *)(*(long *)(src + 8) + 0xab) & 4) != 0) {
      type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
      ::load((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              *)this,*(PyObject **)(src + 0x20),true);
      if ((char)((ulong)uStack_18 >> 0x30) == '\x01') {
        lVar3 = 0;
        do {
          bVar2 = lVar3 == 1;
          if (bVar2) {
            return bVar2;
          }
          lVar1 = lVar3 + 7;
          lVar3 = lVar3 + 1;
        } while (*(char *)((long)&uStack_18 + lVar1) != '\0');
      }
      else {
        bVar2 = false;
      }
      return bVar2;
    }
  }
  __assert_fail("PyTuple_Check(src.ptr())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/cast.h"
                ,0x4f5,
                "bool pybind11::detail::argument_loader<Job *, const std::basic_string<char> &>::load_impl_sequence(handle, index_sequence<Is...>) [Args = <Job *, const std::basic_string<char> &>, Is = <0UL, 1UL>]"
               );
}

Assistant:

bool load_impl_sequence(handle src, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(value).load(PyTuple_GET_ITEM(src.ptr(), Is), true)...})
            if (!r)
                return false;
        return true;
    }